

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O0

void tmvline4_add(void)

{
  DWORD *pDVar1;
  DWORD *pDVar2;
  int iVar3;
  uint uVar4;
  DWORD bg;
  DWORD fg;
  BYTE pix;
  int i;
  DWORD *bg2rgb;
  DWORD *fg2rgb;
  int bits;
  int count;
  BYTE *dest;
  
  iVar3 = tmvlinebits;
  pDVar2 = dc_destblend;
  pDVar1 = dc_srcblend;
  _bits = dc_dest;
  fg2rgb._4_4_ = dc_count;
  do {
    for (fg = 0; (int)fg < 4; fg = fg + 1) {
      if (bufplce[(int)fg][vplce[(int)fg] >> ((byte)iVar3 & 0x1f)] != 0) {
        uVar4 = pDVar1[palookupoffse[(int)fg]
                       [bufplce[(int)fg][vplce[(int)fg] >> ((byte)iVar3 & 0x1f)]]] +
                pDVar2[_bits[(int)fg]] | 0x1f07c1f;
        _bits[(int)fg] = RGB32k.All[uVar4 & uVar4 >> 0xf];
      }
      vplce[(int)fg] = vince[(int)fg] + vplce[(int)fg];
    }
    _bits = _bits + dc_pitch;
    fg2rgb._4_4_ = fg2rgb._4_4_ + -1;
  } while (fg2rgb._4_4_ != 0);
  return;
}

Assistant:

void tmvline4_add ()
{
	BYTE *dest = dc_dest;
	int count = dc_count;
	int bits = tmvlinebits;

	DWORD *fg2rgb = dc_srcblend;
	DWORD *bg2rgb = dc_destblend;

	do
	{
		for (int i = 0; i < 4; ++i)
		{
			BYTE pix = bufplce[i][vplce[i] >> bits];
			if (pix != 0)
			{
				DWORD fg = fg2rgb[palookupoffse[i][pix]];
				DWORD bg = bg2rgb[dest[i]];
				fg = (fg+bg) | 0x1f07c1f;
				dest[i] = RGB32k.All[fg & (fg>>15)];
			}
			vplce[i] += vince[i];
		}
		dest += dc_pitch;
	} while (--count);
}